

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O2

Client * __thiscall
capnp::_::anon_unknown_0::TestContext::Vat::connect<capnproto_test::capnp::test::TestInterface>
          (Client *__return_storage_ptr__,Vat *this,StringPtr to,bool unique)

{
  Reader vatId;
  Own<capnp::ClientHook,_std::nullptr_t> local_180;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  Builder hostId;
  MallocMessageBuilder refMessage;
  
  MallocMessageBuilder::MallocMessageBuilder(&refMessage,0x80,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestSturdyRefHostId>
            (&hostId,&refMessage.super_MessageBuilder);
  capnproto_test::capnp::test::TestSturdyRefHostId::Builder::setHost(&hostId,(Reader)to.content);
  *(byte *)hostId._builder.data = *hostId._builder.data & 0xfe;
  StructBuilder::asReader(&hostId._builder);
  vatId._reader.capTable = (CapTableReader *)uStack_168;
  vatId._reader.segment = (SegmentReader *)local_170;
  vatId._reader.data = (void *)local_160;
  vatId._reader.pointers = (WirePointer *)uStack_158;
  vatId._reader.dataSize = (undefined4)local_150;
  vatId._reader.pointerCount = local_150._4_2_;
  vatId._reader._38_2_ = local_150._6_2_;
  vatId._reader._40_8_ = uStack_148;
  RpcSystemBase::baseBootstrap((RpcSystemBase *)&local_180,vatId);
  Capability::Client::castAs<capnproto_test::capnp::test::TestInterface>
            (__return_storage_ptr__,(Client *)&local_180);
  kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose(&local_180);
  MallocMessageBuilder::~MallocMessageBuilder(&refMessage);
  return __return_storage_ptr__;
}

Assistant:

typename T::Client connect(kj::StringPtr to, bool unique = false) {
      MallocMessageBuilder refMessage(128);
      auto hostId = refMessage.initRoot<test::TestSturdyRefHostId>();
      hostId.setHost(to);
      hostId.setUnique(unique);
      return rpcSystem.bootstrap(hostId).castAs<T>();
    }